

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O2

int __thiscall ReadData::decode(ReadData *this,FILE *file)

{
  int iVar1;
  ostream *poVar2;
  uchar HeadBuff [25];
  uchar auStack_38 [32];
  
  iVar1 = ReadHead(this,file,auStack_38);
  if (iVar1 == 0) {
    iVar1 = ReadMessage(this,file,auStack_38);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"error happened with code ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return iVar1;
}

Assistant:

int ReadData::decode(FILE* file) {
    int flag;
    unsigned char HeadBuff[25];
    flag = ReadHead(file, HeadBuff);
    if(flag != 0) {
        cout << "error happened with code " << flag << endl;
        return flag;
    }
    flag = ReadMessage(file, HeadBuff);

    // find neither eph nor obs
    return flag;
}